

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O3

void __thiscall
MallocExtension::GetHeapGrowthStacks(MallocExtension *this,MallocExtensionWriter *writer)

{
  void *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  void **entry;
  void **entries;
  
  iVar2 = (*this->_vptr_MallocExtension[0x1a])();
  entries = (void **)CONCAT44(extraout_var,iVar2);
  if (entries != (void **)0x0) {
    anon_unknown.dwarf_491ef::PrintHeader(writer,"growth",entries);
    pvVar1 = *entries;
    entry = entries;
    while (pvVar1 != (void *)0x0) {
      anon_unknown.dwarf_491ef::PrintStackEntry(writer,entry);
      entry = entry + (long)entry[2] + 3;
      pvVar1 = *entry;
    }
    operator_delete__(entries);
    DumpAddressMap(writer);
    return;
  }
  std::__cxx11::string::append((char *)writer,0x12fca7);
  return;
}

Assistant:

void MallocExtension::GetHeapGrowthStacks(MallocExtensionWriter* writer) {
  void** entries = ReadHeapGrowthStackTraces();
  if (entries == nullptr) {
    const char* const kErrorMsg =
        "This malloc implementation does not support "
        "ReadHeapGrowthStackTraces().\n"
        "As of 2005/09/27, only tcmalloc supports this, and you\n"
        "are probably running a binary that does not use tcmalloc.\n";
    writer->append(kErrorMsg, strlen(kErrorMsg));
    return;
  }

  // Do not canonicalize the stack entries, so that we get a
  // time-ordered list of stack traces, which may be useful if the
  // client wants to focus on the latest stack traces.
  PrintHeader(writer, "growth", entries);
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    PrintStackEntry(writer, entry);
  }
  delete[] entries;

  DumpAddressMap(writer);
}